

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

ClippedEdge *
MutableS2ShapeIndex::ClipVBound(ClippedEdge *edge,int v_end,double v,EdgeAllocator *alloc)

{
  FaceEdge *pFVar1;
  ClippedEdge *pCVar2;
  double dVar3;
  
  if (v_end == 0) {
    if (v <= (edge->bound).bounds_[1].bounds_.c_[0]) {
      return edge;
    }
  }
  else if ((edge->bound).bounds_[1].bounds_.c_[1] <= v) {
    return edge;
  }
  pFVar1 = edge->face_edge;
  dVar3 = S2::InterpolateDouble
                    (v,(pFVar1->a).c_[1],(pFVar1->b).c_[1],(pFVar1->a).c_[0],(pFVar1->b).c_[0]);
  dVar3 = R1Interval::Project((edge->bound).bounds_,dVar3);
  pCVar2 = UpdateBound(edge,-(uint)((pFVar1->b).c_[1] < (pFVar1->a).c_[1] !=
                                   (pFVar1->b).c_[0] < (pFVar1->a).c_[0]) & 1 ^ v_end,dVar3,v_end,v,
                       alloc);
  return pCVar2;
}

Assistant:

const MutableS2ShapeIndex::ClippedEdge*
MutableS2ShapeIndex::ClipVBound(const ClippedEdge* edge, int v_end, double v,
                                EdgeAllocator* alloc) {
  // See comments in ClipUBound.
  if (v_end == 0) {
    if (edge->bound[1].lo() >= v) return edge;
  } else {
    if (edge->bound[1].hi() <= v) return edge;
  }
  const FaceEdge& e = *edge->face_edge;
  double u = edge->bound[0].Project(
      S2::InterpolateDouble(v, e.a[1], e.b[1], e.a[0], e.b[0]));
  int u_end = v_end ^ ((e.a[0] > e.b[0]) != (e.a[1] > e.b[1]));
  return UpdateBound(edge, u_end, u, v_end, v, alloc);
}